

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QString * __thiscall
QHash<QFontDatabase::WritingSystem,_QString>::value
          (QString *__return_storage_ptr__,QHash<QFontDatabase::WritingSystem,_QString> *this,
          WritingSystem *key)

{
  Data *pDVar1;
  Node<QFontDatabase::WritingSystem,_QString> *pNVar2;
  
  if ((this->d != (Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_> *)0x0) &&
     (pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QFontDatabase::WritingSystem,_QString>_>::
               findNode<QFontDatabase::WritingSystem>(this->d,key),
     pNVar2 != (Node<QFontDatabase::WritingSystem,_QString> *)0x0)) {
    pDVar1 = (pNVar2->value).d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (pNVar2->value).d.ptr;
    (__return_storage_ptr__->d).size = (pNVar2->value).d.size;
    if (pDVar1 == (Data *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }